

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::PluralAvailableLocalesEnumeration::reset
          (PluralAvailableLocalesEnumeration *this,UErrorCode *status)

{
  UErrorCode UVar1;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  UVar1 = *(UErrorCode *)&(this->super_StringEnumeration).field_0x74;
  if (U_ZERO_ERROR < UVar1) {
    *status = UVar1;
    return;
  }
  ures_resetIterator_63(this->fLocales);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }